

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

void Bmc_CexDumpStats(Gia_Man_t *p,Abc_Cex_t *pCex,Abc_Cex_t *pCexCare,Abc_Cex_t *pCexEss,
                     Abc_Cex_t *pCexMin,abctime clk)

{
  int iVar1;
  int iVar2;
  int iVar3;
  FILE *__stream;
  uint uVar4;
  uint nInputs;
  double dVar5;
  
  nInputs = p->vCis->nSize - p->nRegs;
  uVar4 = (pCex->iFrame + 1) * nInputs;
  iVar1 = Bmc_CexBitCount(pCexCare,nInputs);
  iVar2 = Bmc_CexBitCount(pCexEss,nInputs);
  iVar3 = Bmc_CexBitCount(pCexMin,nInputs);
  __stream = fopen("cex/stats.txt","a+");
  fprintf(__stream,"%s ",p->pName);
  fprintf(__stream,"%d ",(ulong)nInputs);
  fprintf(__stream,"%d ",(ulong)(uint)p->nRegs);
  fprintf(__stream,"%d ",(ulong)(pCex->iFrame + 1));
  fprintf(__stream,"%d ",(ulong)uVar4);
  dVar5 = (double)(int)uVar4;
  fprintf(__stream,"%.2f ",((double)(int)(uVar4 - iVar1) * 100.0) / dVar5);
  fprintf(__stream,"%.2f ",((double)(iVar1 - iVar2) * 100.0) / dVar5);
  fprintf(__stream,"%.2f ",((double)iVar2 * 100.0) / dVar5);
  fprintf(__stream,"%.2f ",((double)iVar3 * 100.0) / dVar5);
  fprintf(__stream,"%.2f ",(double)clk / 1000000.0);
  fputc(10,__stream);
  fclose(__stream);
  return;
}

Assistant:

void Bmc_CexDumpStats( Gia_Man_t * p, Abc_Cex_t * pCex, Abc_Cex_t * pCexCare, Abc_Cex_t * pCexEss, Abc_Cex_t * pCexMin, abctime clk )
{
    int nInputs    = Gia_ManPiNum(p);
    int nBitsTotal = (pCex->iFrame + 1) * nInputs;
    int nBitsCare  = Bmc_CexBitCount(pCexCare, nInputs);
    int nBitsDC    = nBitsTotal - nBitsCare;
    int nBitsEss   = Bmc_CexBitCount(pCexEss, nInputs);
    int nBitsOpt   = nBitsCare - nBitsEss;
    int nBitsMin   = Bmc_CexBitCount(pCexMin, nInputs);

    FILE * pTable  = fopen( "cex/stats.txt", "a+" );
    fprintf( pTable, "%s ", p->pName );
    fprintf( pTable, "%d ", nInputs );
    fprintf( pTable, "%d ", Gia_ManRegNum(p) );
    fprintf( pTable, "%d ", pCex->iFrame + 1 );
    fprintf( pTable, "%d ", nBitsTotal );
    fprintf( pTable, "%.2f ", 100.0 * nBitsDC  / nBitsTotal );
    fprintf( pTable, "%.2f ", 100.0 * nBitsOpt / nBitsTotal );
    fprintf( pTable, "%.2f ", 100.0 * nBitsEss / nBitsTotal );
    fprintf( pTable, "%.2f ", 100.0 * nBitsMin / nBitsTotal );
    fprintf( pTable, "%.2f ", 1.0*clk/(CLOCKS_PER_SEC) );
    fprintf( pTable, "\n" );
    fclose( pTable );
}